

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * __thiscall IR::Instr::GetBlockStartInstr(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *local_18;
  Instr *instr;
  Instr *this_local;
  
  local_18 = this->m_prev;
  while( true ) {
    do {
      bVar2 = StartsBasicBlock(local_18);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        return local_18;
      }
      local_18 = local_18->m_prev;
    } while (local_18 != (Instr *)0x0);
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xb6f,"(instr)","GetBlockStartInstr() failed...");
    if (!bVar2) break;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

IR::Instr *
Instr::GetBlockStartInstr() const
{
    IR::Instr *instr = this->m_prev;

    while (!instr->StartsBasicBlock())
    {
        instr = instr->m_prev;
        AssertMsg(instr, "GetBlockStartInstr() failed...");
    }
    return instr;
}